

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

_Bool mpack_expect_array_or_nil(mpack_reader_t *reader,uint32_t *count)

{
  mpack_tag_t mVar1;
  undefined4 local_30;
  mpack_tag_t var;
  uint32_t *count_local;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_read_tag(reader);
  if (mVar1.type == mpack_type_nil) {
    *count = 0;
    reader_local._7_1_ = false;
  }
  else if (mVar1.type == mpack_type_array) {
    local_30 = mVar1.v._0_4_;
    *count = local_30;
    reader_local._7_1_ = true;
  }
  else {
    mpack_reader_flag_error(reader,mpack_error_type);
    *count = 0;
    reader_local._7_1_ = false;
  }
  return reader_local._7_1_;
}

Assistant:

bool mpack_expect_array_or_nil(mpack_reader_t* reader, uint32_t* count) {
    mpack_assert(count != NULL, "count cannot be NULL");

    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_nil) {
        *count = 0;
        return false;
    }
    if (var.type == mpack_type_array) {
        *count = var.v.n;
        return true;
    }
    mpack_reader_flag_error(reader, mpack_error_type);
    *count = 0;
    return false;
}